

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstructCondense.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstructCondense<double>::Contribute_Kc
          (TPZDohrSubstructCondense<double> *this,TPZMatrix<double> *Kc,TPZVec<int> *coarseindex)

{
  double dVar1;
  int iVar2;
  long lVar3;
  double *pdVar4;
  long col;
  long row;
  
  lVar3 = (this->fCoarseNodes).fNElements;
  row = 0;
  do {
    if (lVar3 <= row) {
      return;
    }
    for (col = 0; col < lVar3; col = col + 1) {
      iVar2 = (*(Kc->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(Kc);
      if ((iVar2 == 0) || (coarseindex->fStore[col] < coarseindex->fStore[row])) {
        iVar2 = (*(Kc->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(Kc);
        if (iVar2 == 0) goto LAB_01275bf7;
      }
      else {
LAB_01275bf7:
        pdVar4 = TPZFMatrix<double>::operator()(&this->fKCi,row,col);
        dVar1 = *pdVar4;
        pdVar4 = TPZMatrix<double>::operator()
                           (Kc,(long)coarseindex->fStore[row],(long)coarseindex->fStore[col]);
        *pdVar4 = dVar1 + *pdVar4;
      }
      lVar3 = (this->fCoarseNodes).fNElements;
    }
    row = row + 1;
  } while( true );
}

Assistant:

void TPZDohrSubstructCondense<TVar>::Contribute_Kc(TPZMatrix<TVar> &Kc, TPZVec<int> &coarseindex) {
	int i;
	int j;
	for (i=0;i<fCoarseNodes.NElements();i++) {
		for (j=0;j<fCoarseNodes.NElements();j++) {
			if ((Kc.IsSymmetric() && coarseindex[j] >= coarseindex[i]) || !Kc.IsSymmetric()) {
				Kc(coarseindex[i],coarseindex[j]) += fKCi(i,j);				
			}
		}
	}
}